

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vision.c
# Opt level: O1

void do_clear_area(int scol,int srow,int range,_func_void_int_int_void_ptr *func,void *arg)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  
  if ((u.ux == scol) && (u.uy == srow)) {
    if (range - 0x10U < 0xfffffff1) {
      panic("do_clear_area:  illegal range %d",(ulong)(uint)range);
    }
    if (vision_full_recalc != '\0') {
      vision_recalc(0);
    }
    iVar3 = 0x14;
    if (range + srow < 0x14) {
      iVar3 = range + srow;
    }
    uVar6 = srow - range;
    if ((int)uVar6 < 1) {
      uVar6 = 0;
    }
    if ((int)uVar6 <= iVar3) {
      cVar1 = ""[range];
      uVar7 = (ulong)uVar6;
      do {
        uVar4 = (int)uVar7 - srow;
        uVar6 = -uVar4;
        if (0 < (int)uVar4) {
          uVar6 = uVar4;
        }
        uVar4 = scol - "\x01\x01\x02\x02\x01\x03\x03\x02\x01\x04\x04\x04\x03\x02\x05\x05\x05\x04\x03\x02\x06\x06\x06\x05\x05\x04\x02\a\a\a\x06\x06\x05\x04\x02\b\b\b\a\a\x06\x06\x04\x02\t\t\t\t\b\b\a\x06\x05\x03\n\n\n\n\t\t\b\a\x06\x05\x03\v\v\v\v\n\n\t\t\b\a\x05\x03\f\f\f\f\v\v\n\n\t\b\a\x05\x03\r\r\r\r\f\f\f\v\n\n\t\a\x06\x03\x0e\x0e\x0e\x0e\r\r\r\f\f\v\n\t\b\x06\x03\x0f\x0f\x0f\x0f\x0e\x0e\x0e\r\r\f\v\n\t\b\x06\x03\x10"
                       [(ulong)uVar6 + (long)cVar1];
        if ((int)uVar4 < 1) {
          uVar4 = 0;
        }
        iVar5 = "\x01\x01\x02\x02\x01\x03\x03\x02\x01\x04\x04\x04\x03\x02\x05\x05\x05\x04\x03\x02\x06\x06\x06\x05\x05\x04\x02\a\a\a\x06\x06\x05\x04\x02\b\b\b\a\a\x06\x06\x04\x02\t\t\t\t\b\b\a\x06\x05\x03\n\n\n\n\t\t\b\a\x06\x05\x03\v\v\v\v\n\n\t\t\b\a\x05\x03\f\f\f\f\v\v\n\n\t\b\a\x05\x03\r\r\r\r\f\f\f\v\n\n\t\a\x06\x03\x0e\x0e\x0e\x0e\r\r\r\f\f\v\n\t\b\x06\x03\x0f\x0f\x0f\x0f\x0e\x0e\x0e\r\r\f\v\n\t\b\x06\x03\x10"
                [(ulong)uVar6 + (long)cVar1] + scol;
        if (0x4e < iVar5) {
          iVar5 = 0x4f;
        }
        if ((int)uVar4 <= iVar5) {
          uVar8 = (ulong)uVar4;
          do {
            if ((viz_array[uVar7][uVar8] & 1U) != 0) {
              (*func)((int)uVar8,(int)uVar7,arg);
            }
            bVar2 = (long)uVar8 < (long)iVar5;
            uVar8 = uVar8 + 1;
          } while (bVar2);
        }
        bVar2 = (long)uVar7 < (long)iVar3;
        uVar7 = uVar7 + 1;
      } while (bVar2);
    }
  }
  else {
    view_from(srow,scol,(char **)0x0,(char *)0x0,(char *)0x0,range,func,arg);
  }
  return;
}

Assistant:

void do_clear_area(int scol, int srow, int range,
		   void (*func)(int,int,void *), void *arg)
{
	/* If not centered on hero, do the hard work of figuring the area */
	if (scol != u.ux || srow != u.uy)
	    view_from(srow, scol, NULL, NULL, NULL,
							range, func, arg);
	else {
	    int x;
	    int y, min_x, max_x, max_y, offset;
	    const char *limits;

	    if (range > MAX_RADIUS || range < 1)
		panic("do_clear_area:  illegal range %d", range);
	    if (vision_full_recalc)
		vision_recalc(0);	/* recalc vision if dirty */
	    limits = circle_ptr(range);
	    if ((max_y = (srow + range)) >= ROWNO) max_y = ROWNO-1;
	    if ((y = (srow - range)) < 0) y = 0;
	    for (; y <= max_y; y++) {
		offset = limits[v_abs(y-srow)];
		if ((min_x = (scol - offset)) < 0) min_x = 0;
		if ((max_x = (scol + offset)) >= COLNO) max_x = COLNO-1;
		for (x = min_x; x <= max_x; x++)
		    if (couldsee(x, y))
			(*func)(x, y, arg);
	    }
	}
}